

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

ItemList *
Lib::UniquePersistentIterator<Lib::Stack<Kernel::Clause_*>::Iterator>::getUniqueItemList
          (Iterator *inn,size_t *sizeRef)

{
  Clause **ppCVar1;
  Clause *elem;
  bool bVar2;
  List<Kernel::Clause_*> *l;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_30;
  
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_30);
  *sizeRef = 0;
  l = (List<Kernel::Clause_*> *)0x0;
  while (ppCVar1 = (inn->super_RefIterator)._pointer,
        ppCVar1 != ((inn->super_RefIterator)._stack)->_stack) {
    (inn->super_RefIterator)._pointer = ppCVar1 + -1;
    elem = ppCVar1[-1];
    bVar2 = DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<Kernel::Clause_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)local_30._self._M_t.
                          super___uniq_ptr_impl<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                          .
                          super__Head_base<0UL,_Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                          ._M_head_impl,elem);
    if (bVar2) {
      l = List<Kernel::Clause_*>::cons(elem,l);
      *sizeRef = *sizeRef + 1;
    }
  }
  Recycled<Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_30);
  return l;
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }